

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

xchar dname_to_dnum(char *s,boolean optional)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  
  iVar1 = n_dgns;
  if (0 < n_dgns) {
    uVar4 = 0;
    do {
      iVar2 = strcmp(dungeons[(char)uVar4].dname,s);
      if (iVar2 == 0) goto LAB_0018be2b;
      bVar3 = (char)uVar4 + 1;
      uVar4 = (uint)bVar3;
    } while ((char)bVar3 < iVar1);
  }
  uVar4 = iVar1;
  if (optional == '\0') {
    panic("Couldn\'t resolve dungeon number for name \"%s\".",s);
  }
LAB_0018be2b:
  return (xchar)uVar4;
}

Assistant:

static xchar dname_to_dnum(const char *s, boolean optional)
{
	xchar	i;

	for (i = 0; i < n_dgns; i++)
	    if (!strcmp(dungeons[i].dname, s)) return i;

	if (optional)
	    return n_dgns;	/* bogus dnum instead of panicking */

	panic("Couldn't resolve dungeon number for name \"%s\".", s);
	/*NOT REACHED*/
	return (xchar)0;
}